

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache_inlines.h
# Opt level: O0

void tcache_max_set(tcache_slow_t *tcache_slow,size_t tcache_max)

{
  ulong in_RSI;
  long in_RDI;
  szind_t ret;
  uint local_18;
  size_t in_stack_fffffffffffffff8;
  
  if (in_RSI < 0x1001) {
    local_18 = (uint)duckdb_je_sz_size2index_tab[in_RSI + 7 >> 3];
  }
  else {
    local_18 = sz_size2index_compute(in_stack_fffffffffffffff8);
  }
  *(uint *)(in_RDI + 0x30) = local_18 + 1;
  return;
}

Assistant:

static inline void
tcache_max_set(tcache_slow_t *tcache_slow, size_t tcache_max) {
	assert(tcache_slow != NULL);
	assert(tcache_max <= TCACHE_MAXCLASS_LIMIT);
	tcache_slow->tcache_nbins = sz_size2index(tcache_max) + 1;
}